

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O3

uint64_t basisu::color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  bc7enc_bool bVar1;
  byte bVar2;
  byte bVar3;
  color_quad_u8 *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  color_quad_u8 *pcVar9;
  uint uVar10;
  uint64_t uVar11;
  ulong uVar12;
  color_cell_compressor_results *pcVar13;
  uint *b;
  char cVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t mode_00;
  uint uVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  color_quad_u8 cVar40;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar47 [16];
  float fVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar52;
  undefined1 auVar50 [16];
  float fVar53;
  undefined4 uVar55;
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  uint8_t auVar58 [4];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar59;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar69;
  undefined8 uVar65;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar85 [12];
  float fVar87;
  float fVar88;
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  bc7enc_vec4F xl;
  bc7enc_vec4F xl_00;
  bc7enc_vec4F xl_01;
  bc7enc_vec4F xl_02;
  bc7enc_vec4F xl_03;
  bc7enc_vec4F xl_04;
  bc7enc_vec4F xh;
  bc7enc_vec4F xh_00;
  bc7enc_vec4F xh_01;
  bc7enc_vec4F xh_02;
  bc7enc_vec4F xh_03;
  bc7enc_vec4F xh_04;
  uint32_t cb;
  uint32_t cg;
  uint32_t cr;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  color_quad_u8 local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  bc7enc_vec4F local_c8;
  undefined1 local_b8 [24];
  uint8_t *puStack_a0;
  color_quad_u8 local_8c;
  bc7enc_compress_block_params *local_88;
  uint local_7c;
  color_cell_compressor_results local_78;
  int local_40;
  float local_3c;
  ulong local_38;
  
  local_d8 = mode;
  local_88 = pComp_params;
  if (((mode != 6) && (pParams->m_astc_endpoint_range == 0)) && (pParams->m_has_alpha != '\0')) {
    __assert_fail("(mode == 6) || (!pParams->m_has_alpha)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x55e,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (0x1f < pParams->m_num_selector_weights - 1) {
    __assert_fail("pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x560,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  b = pParams->m_pSelector_weights;
  if (*(uint32_t *)((color_quad_u8 *)b)->m_c != 0) {
    __assert_fail("pParams->m_pSelector_weights[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x561,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (*(uint32_t *)((color_quad_u8 *)b)[(ulong)pParams->m_num_selector_weights - 1].m_c != 0x40) {
    __assert_fail("pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x562,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  pResults->m_best_overall_err = 0xffffffffffffffff;
  if (pParams->m_pForce_selectors == (uint8_t *)0x0) {
    if (mode == 1) {
      b = (uint *)&local_e4;
      bVar22 = is_solid_rgb(pParams,&local_dc,&local_e0,b);
      if (bVar22) {
        uVar11 = pack_mode1_to_one_color
                           (pParams,pResults,local_dc,local_e0,(uint32_t)local_e4.m_c,
                            pResults->m_pSelectors);
        return uVar11;
      }
    }
    else {
      b = &switchD_002072ee::switchdataD_00316730;
      switch(pParams->m_astc_endpoint_range) {
      case 7:
        if ((pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha == '\0')) {
          b = (uint *)&local_e4;
          bVar22 = is_solid_rgb(pParams,&local_dc,&local_e0,b);
          if (bVar22) {
            uVar11 = pack_astc_range7_2bit_to_one_color
                               (pParams,pResults,local_dc,local_e0,(uint32_t)local_e4.m_c,
                                pResults->m_pSelectors);
            return uVar11;
          }
        }
        break;
      case 8:
        if (pParams->m_num_selector_weights == 4) {
          if (pParams->m_has_alpha != '\0') {
            pcVar4 = pParams->m_pPixels;
            bVar2 = pcVar4->m_c[0];
            local_dc = (uint)bVar2;
            bVar3 = pcVar4->m_c[1];
            b = (uint *)0x0;
            local_e0 = (uint)bVar3;
            local_e4.m_c[1] = '\0';
            local_e4.m_c[2] = '\0';
            local_e4.m_c[3] = '\0';
            local_e4.m_c[0] = pcVar4->m_c[2];
            uVar12 = (ulong)pParams->m_num_pixels;
            if (uVar12 < 2) {
LAB_00207e34:
              uVar11 = pack_astc_4bit_2bit_to_one_color_rgba
                                 (pParams,pResults,local_dc,local_e0,(uint32_t)local_e4.m_c,
                                  (uint)pcVar4->m_c[3],pResults->m_pSelectors);
              return uVar11;
            }
            if ((bVar2 == pcVar4[1].m_c[0]) && (bVar3 == pcVar4[1].m_c[1])) {
              bVar22 = false;
              uVar16 = 2;
              while (((pcVar4->m_c[2] == pcVar4[uVar16 - 1].m_c[2] &&
                      (pcVar4->m_c[3] == pcVar4[uVar16 - 1].m_c[3])) &&
                     (bVar22 = uVar12 <= uVar16, uVar16 != uVar12))) {
                if ((bVar2 != pcVar4[uVar16].m_c[0]) ||
                   (pcVar9 = pcVar4 + uVar16, uVar16 = uVar16 + 1, bVar3 != pcVar9->m_c[1])) break;
              }
              if (bVar22) goto LAB_00207e34;
            }
          }
        }
        else if ((pParams->m_num_selector_weights == 8) && (pParams->m_has_alpha == '\0')) {
          b = (uint *)&local_e4;
          bVar22 = is_solid_rgb(pParams,&local_dc,&local_e0,b);
          if (bVar22) {
            uVar11 = pack_astc_4bit_3bit_to_one_color
                               (pParams,pResults,local_dc,local_e0,(uint32_t)local_e4.m_c,
                                pResults->m_pSelectors);
            return uVar11;
          }
        }
        break;
      case 0xb:
        if ((pParams->m_num_selector_weights == 0x20) && (pParams->m_has_alpha == '\0')) {
          b = (uint *)&local_e4;
          bVar22 = is_solid_rgb(pParams,&local_dc,&local_e0,b);
          if (bVar22) {
            uVar11 = pack_astc_range11_5bit_to_one_color
                               (pParams,pResults,local_dc,local_e0,(uint32_t)local_e4.m_c,
                                pResults->m_pSelectors);
            return uVar11;
          }
        }
        break;
      case 0xd:
        if ((pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha == '\0')) {
          b = (uint *)&local_e4;
          bVar22 = is_solid_rgb(pParams,&local_dc,&local_e0,b);
          if (bVar22) {
            uVar11 = pack_astc_range13_2bit_to_one_color
                               (pParams,pResults,local_dc,local_e0,(uint32_t)local_e4.m_c,
                                pResults->m_pSelectors);
            return uVar11;
          }
        }
      }
    }
  }
  uVar12 = (ulong)pParams->m_num_pixels;
  if (uVar12 == 0) {
    fVar39 = 0.0;
    fVar43 = 0.0;
    fVar44 = 0.0;
    fVar45 = 0.0;
    fVar33 = 0.0;
    fVar36 = 0.0;
    fVar37 = 0.0;
    fVar38 = 0.0;
  }
  else {
    b = (uint *)pParams->m_pPixels;
    fVar33 = 0.0;
    fVar36 = 0.0;
    fVar37 = 0.0;
    fVar38 = 0.0;
    uVar16 = 0;
    fVar39 = 0.0;
    fVar43 = 0.0;
    fVar44 = 0.0;
    fVar45 = 0.0;
    do {
      auVar24 = pmovzxbd(ZEXT216(*(ushort *)((color_quad_u8 *)b)[uVar16].m_c),
                         ZEXT216(*(ushort *)((color_quad_u8 *)b)[uVar16].m_c));
      fVar39 = fVar39 + (float)auVar24._0_4_;
      fVar43 = fVar43 + (float)auVar24._4_4_;
      fVar44 = fVar44 + (float)auVar24._8_4_;
      fVar45 = fVar45 + (float)auVar24._12_4_;
      auVar24 = pmovzxbd(ZEXT216(*(ushort *)(((color_quad_u8 *)b)[uVar16].m_c + 2)),
                         ZEXT216(*(ushort *)(((color_quad_u8 *)b)[uVar16].m_c + 2)));
      fVar33 = fVar33 + (float)auVar24._0_4_;
      fVar36 = fVar36 + (float)auVar24._4_4_;
      fVar37 = fVar37 + (float)auVar24._8_4_;
      fVar38 = fVar38 + (float)auVar24._12_4_;
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
  }
  fVar53 = 1.0 / ((float)uVar12 * 255.0);
  fVar46 = fVar39 * fVar53;
  auVar58 = (uint8_t  [4])(fVar43 * fVar53);
  local_8c.m_c[0] = '\0';
  local_8c.m_c[1] = '\0';
  local_8c.m_c[2] = '\0';
  local_8c.m_c[3] = '\0';
  local_d0 = 0.0;
  if ((0.0 <= fVar46) && (local_d0 = fVar46, 1.0 < fVar46)) {
    local_d0 = 1.0;
  }
  fVar46 = fVar33 * fVar53;
  if ((0.0 <= (float)auVar58) && (local_8c.m_c = auVar58, 1.0 < (float)auVar58)) {
    local_8c.m_c[0] = '\0';
    local_8c.m_c[1] = '\0';
    local_8c.m_c[2] = 0x80;
    local_8c.m_c[3] = '?';
  }
  fVar23 = 1.0 / (float)uVar12;
  fVar53 = fVar36 * fVar53;
  local_cc = 0.0;
  if ((0.0 <= fVar46) && (local_cc = fVar46, 1.0 < fVar46)) {
    local_cc = 1.0;
  }
  local_d4 = 0.0;
  if ((0.0 <= fVar53) && (local_d4 = fVar53, 1.0 < fVar53)) {
    local_d4 = 1.0;
  }
  fVar39 = fVar39 * fVar23;
  fVar43 = fVar43 * fVar23;
  fVar33 = fVar33 * fVar23;
  bVar1 = pParams->m_has_alpha;
  pcVar13 = (color_cell_compressor_results *)CONCAT71((int7)((ulong)b >> 8),bVar1);
  if (bVar1 == '\0') {
    if (uVar12 == 0) {
      auVar24 = ZEXT816(0);
      auVar25 = ZEXT816(0);
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar46 = 0.0;
      fVar53 = 0.0;
      fVar59 = 0.0;
      fVar51 = 0.0;
    }
    else {
      uVar16 = 0;
      fVar46 = 0.0;
      fVar53 = 0.0;
      fVar59 = 0.0;
      fVar51 = 0.0;
      fVar37 = 0.0;
      fVar64 = 0.0;
      fVar38 = 0.0;
      fVar69 = 0.0;
      auVar25 = ZEXT816(0);
      do {
        auVar24 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar16].m_c);
        auVar24 = pmovzxbd(auVar24,auVar24);
        fVar70 = (float)pParams->m_pPixels[uVar16].m_c[2] - fVar33;
        auVar29._0_4_ = (float)auVar24._0_4_ - fVar39;
        auVar29._4_4_ = (float)auVar24._4_4_ - fVar43;
        auVar29._8_4_ = (float)auVar24._8_4_ - fVar44 * 0.0;
        auVar29._12_4_ = (float)auVar24._12_4_ - fVar45 * 0.0;
        fVar46 = fVar46 + auVar29._0_4_ * auVar29._0_4_;
        fVar53 = fVar53 + auVar29._4_4_ * auVar29._4_4_;
        fVar59 = fVar59 + auVar29._8_4_ * auVar29._8_4_;
        fVar51 = fVar51 + auVar29._12_4_ * auVar29._12_4_;
        auVar24._0_4_ = auVar25._0_4_ + fVar70 * auVar29._0_4_;
        auVar24._4_4_ = auVar25._4_4_ + fVar70 * auVar29._4_4_;
        auVar24._8_4_ = auVar25._8_4_ + auVar29._8_4_ * 0.0;
        auVar24._12_4_ = auVar25._12_4_ + auVar29._12_4_ * 0.0;
        auVar32._4_4_ = auVar29._4_4_;
        auVar32._0_4_ = auVar29._4_4_;
        auVar32._8_4_ = auVar29._12_4_;
        auVar32._12_4_ = auVar29._12_4_;
        auVar25 = insertps(auVar29,ZEXT416((uint)fVar70),0x10);
        auVar29 = insertps(auVar32,ZEXT416((uint)fVar70),0x10);
        fVar37 = fVar37 + auVar29._0_4_ * auVar25._0_4_;
        fVar64 = fVar64 + auVar29._4_4_ * auVar25._4_4_;
        fVar38 = fVar38 + auVar29._8_4_ * auVar25._8_4_;
        fVar69 = fVar69 + auVar29._12_4_ * auVar25._12_4_;
        uVar16 = uVar16 + 1;
        auVar25 = auVar24;
      } while (uVar12 != uVar16);
      auVar25._4_4_ = fVar64;
      auVar25._0_4_ = fVar64;
      auVar25._8_4_ = fVar69;
      auVar25._12_4_ = fVar69;
    }
    auVar25 = blendps(auVar25,auVar24,0xe);
    auVar29 = ZEXT816(0x3f8000003f666666);
    auVar35._0_12_ = ZEXT812(0x3f333333);
    auVar35._12_4_ = 0;
    iVar15 = 3;
    do {
      fVar44 = auVar29._0_4_;
      auVar50._0_4_ = auVar35._0_4_ * auVar24._0_4_ + fVar37 * auVar29._4_4_ + fVar46 * fVar44;
      auVar50._4_4_ = auVar35._0_4_ * auVar24._4_4_ + fVar37 * fVar44 + fVar53 * auVar29._4_4_;
      auVar50._8_4_ =
           auVar35._8_4_ * auVar24._8_4_ + fVar38 * auVar29._8_4_ + fVar59 * auVar29._8_4_;
      auVar50._12_4_ =
           auVar35._8_4_ * auVar24._12_4_ + fVar38 * auVar29._12_4_ + fVar51 * auVar29._12_4_;
      auVar29 = blendps(auVar35,auVar29,0xe);
      fVar45 = auVar29._4_4_ * auVar25._4_4_;
      fVar64 = auVar29._12_4_ * auVar25._12_4_;
      auVar42._4_4_ = fVar45;
      auVar42._0_4_ = fVar45;
      auVar42._8_4_ = fVar64;
      auVar42._12_4_ = fVar64;
      auVar35._4_12_ = auVar42._4_12_;
      fVar45 = fVar45 + fVar44 * auVar24._0_4_ + auVar29._0_4_ * auVar25._0_4_;
      fVar44 = ABS(auVar50._0_4_);
      if (ABS(auVar50._0_4_) <= ABS(auVar50._4_4_)) {
        fVar44 = ABS(auVar50._4_4_);
      }
      if (fVar44 <= ABS(fVar45)) {
        fVar44 = ABS(fVar45);
      }
      fVar64 = 1.0 / fVar44;
      if (1e-10 < fVar44) {
        fVar45 = fVar45 * fVar64;
      }
      auVar35._0_4_ = fVar45;
      auVar63._0_4_ = (uint)(1e-10 < fVar44) << 0x1f;
      auVar63._4_4_ = (uint)(1e-10 < fVar44) << 0x1f;
      auVar63._8_8_ = 0;
      auVar57._4_4_ = fVar64 * auVar50._4_4_;
      auVar57._0_4_ = fVar64 * auVar50._0_4_;
      auVar57._8_4_ = auVar50._8_4_ * 0.0;
      auVar57._12_4_ = auVar50._12_4_ * 0.0;
      auVar29 = blendvps(auVar50,auVar57,auVar63);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    fVar38 = auVar29._0_4_;
    fVar44 = auVar29._4_4_;
    fVar37 = fVar45 * fVar45 + fVar38 * fVar38 + fVar44 * fVar44;
    auVar49 = ZEXT816(0);
    auVar68 = ZEXT816(0);
    if (1e-10 <= fVar37) {
      fVar37 = 1.0 / SQRT(fVar37);
      auVar68._4_4_ = fVar44 * fVar37;
      auVar68._0_4_ = fVar38 * fVar37;
      auVar49 = ZEXT416((uint)(fVar45 * fVar37));
      auVar68._8_4_ = auVar29._8_4_ * 0.0;
      auVar68._12_4_ = auVar29._12_4_ * 0.0;
    }
  }
  else {
    if (uVar12 == 0) {
      auVar49._0_12_ = ZEXT812(0);
      auVar49._12_4_ = 0.0;
      auVar68 = ZEXT816(0);
    }
    else {
      auVar47._0_12_ = ZEXT812(0);
      auVar47._12_4_ = 0;
      uVar16 = 0;
      auVar68 = ZEXT816(0);
      do {
        auVar24 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar16].m_c);
        auVar24 = pmovzxbd(auVar24,auVar24);
        auVar25 = ZEXT216(*(ushort *)(pParams->m_pPixels[uVar16].m_c + 2));
        auVar25 = pmovzxbd(auVar25,auVar25);
        fVar64 = (float)auVar24._0_4_ - fVar39;
        fVar69 = (float)auVar24._4_4_ - fVar43;
        fVar70 = (float)auVar24._8_4_ - fVar44 * 0.0;
        fVar72 = (float)auVar24._12_4_ - fVar45 * 0.0;
        auVar60._0_4_ = (float)auVar25._0_4_ - fVar33;
        auVar60._4_4_ = (float)auVar25._4_4_ - fVar36 * fVar23;
        auVar60._8_4_ = (float)auVar25._8_4_ - fVar37 * 0.0;
        auVar60._12_4_ = (float)auVar25._12_4_ - fVar38 * 0.0;
        auVar26._0_4_ = (uint)(uVar16 == 0) << 0x1f;
        auVar26._4_4_ = (uint)(uVar16 == 0) << 0x1f;
        auVar26._8_8_ = 0;
        fVar53 = auVar68._4_4_;
        fVar59 = auVar68._8_4_;
        fVar51 = auVar68._12_4_;
        auVar78._4_4_ = auVar68._0_4_;
        auVar78._0_4_ = fVar53;
        auVar78._8_4_ = fVar59;
        auVar78._12_4_ = fVar51;
        auVar5._4_4_ = fVar64;
        auVar5._0_4_ = fVar69;
        auVar5._8_4_ = fVar70;
        auVar5._12_4_ = fVar72;
        auVar79 = blendvps(auVar78,auVar5,auVar26);
        fVar71 = auVar79._0_4_;
        fVar73 = auVar79._4_4_;
        fVar74 = auVar79._8_4_;
        fVar75 = auVar79._12_4_;
        auVar24 = blendvps(auVar47,auVar60,auVar26);
        auVar85 = auVar24._0_12_;
        fVar76 = auVar24._0_4_;
        fVar46 = auVar24._4_4_;
        fVar88 = auVar24._12_4_;
        fVar89 = fVar46 * fVar46 + fVar71 * fVar71 + fVar73 * fVar73 + fVar76 * fVar76;
        if ((fVar89 != 0.0) || (NAN(fVar89))) {
          fVar89 = 1.0 / SQRT(fVar89);
          auVar79._0_4_ = fVar71 * fVar89;
          auVar79._4_4_ = fVar73 * fVar89;
          auVar79._8_4_ = fVar74 * 0.0;
          auVar79._12_4_ = fVar75 * 0.0;
          auVar86._0_4_ = fVar76 * fVar89;
          auVar86._4_12_ = auVar24._4_12_;
          auVar85 = auVar86._0_12_;
          fVar46 = fVar46 * fVar89;
        }
        fVar74 = fVar69 * auVar60._0_4_;
        fVar75 = fVar64 * auVar60._4_4_;
        fVar76 = fVar70 * auVar60._8_4_;
        fVar89 = fVar72 * auVar60._12_4_;
        uVar65 = CONCAT44(fVar69 * auVar60._4_4_,fVar64 * auVar60._0_4_);
        fVar71 = fVar70 * auVar60._8_4_;
        fVar73 = fVar72 * auVar60._12_4_;
        fVar90 = auVar60._0_4_ * auVar60._4_4_;
        fVar91 = auVar60._8_4_ * auVar60._12_4_;
        auVar61._0_4_ = auVar60._0_4_ * auVar60._0_4_;
        auVar61._4_4_ = auVar60._4_4_ * auVar60._4_4_;
        auVar61._8_4_ = auVar60._8_4_ * auVar60._8_4_;
        auVar61._12_4_ = auVar60._12_4_ * auVar60._12_4_;
        fVar77 = auVar79._0_4_;
        fVar81 = auVar79._4_4_;
        fVar82 = auVar79._8_4_;
        fVar83 = auVar79._12_4_;
        auVar92._8_4_ = fVar71;
        auVar92._0_8_ = uVar65;
        auVar92._12_4_ = fVar73;
        auVar6._4_4_ = fVar75;
        auVar6._0_4_ = fVar74;
        auVar6._8_4_ = fVar76;
        auVar6._12_4_ = fVar89;
        auVar24 = insertps(auVar92,auVar6,0x1c);
        fVar84 = auVar85._0_4_;
        fVar87 = auVar85._8_4_;
        auVar93._8_4_ = fVar71;
        auVar93._0_8_ = uVar65;
        auVar93._12_4_ = fVar73;
        auVar7._4_4_ = fVar75;
        auVar7._0_4_ = fVar74;
        auVar7._8_4_ = fVar76;
        auVar7._12_4_ = fVar89;
        auVar25 = insertps(auVar93,auVar7,0x4c);
        auVar68._0_4_ =
             auVar68._0_4_ +
             auVar25._0_4_ * fVar46 +
             auVar24._0_4_ * fVar84 + fVar64 * fVar64 * fVar81 + fVar64 * fVar69 * fVar77;
        auVar68._4_4_ =
             fVar53 + auVar25._4_4_ * fVar46 +
                      auVar24._4_4_ * fVar84 + fVar69 * fVar69 * fVar77 + fVar64 * fVar69 * fVar81;
        auVar68._8_4_ =
             fVar59 + auVar25._8_4_ * fVar88 +
                      auVar24._8_4_ * fVar87 + fVar70 * fVar70 * fVar82 + fVar70 * fVar70 * fVar82;
        auVar68._12_4_ =
             fVar51 + auVar25._12_4_ * fVar88 +
                      auVar24._12_4_ * fVar87 + fVar72 * fVar72 * fVar83 + fVar70 * fVar70 * fVar83;
        auVar66._4_4_ = fVar90;
        auVar66._0_4_ = fVar90;
        auVar66._8_4_ = fVar91;
        auVar66._12_4_ = fVar91;
        auVar24 = blendps(auVar66,auVar61,2);
        auVar49._0_4_ =
             auVar47._0_4_ +
             auVar24._0_4_ * fVar46 +
             fVar84 * auVar60._0_4_ * auVar60._0_4_ +
             fVar81 * fVar64 * auVar60._0_4_ + fVar74 * fVar77;
        auVar49._4_4_ =
             auVar47._4_4_ +
             auVar24._4_4_ * fVar46 +
             fVar84 * fVar90 + fVar77 * fVar69 * auVar60._4_4_ + fVar75 * fVar81;
        auVar49._8_4_ =
             auVar47._8_4_ +
             auVar24._8_4_ * fVar88 +
             fVar87 * auVar60._8_4_ * auVar60._8_4_ + fVar82 * fVar71 + fVar76 * fVar82;
        auVar49._12_4_ =
             auVar47._12_4_ +
             auVar24._12_4_ * fVar88 + fVar87 * fVar91 + fVar83 * fVar73 + fVar89 * fVar83;
        uVar16 = uVar16 + 1;
        auVar47 = auVar49;
      } while (uVar12 != uVar16);
    }
    fVar53 = auVar68._0_4_;
    fVar59 = auVar68._4_4_;
    fVar51 = auVar68._8_4_;
    fVar64 = auVar68._12_4_;
    fVar38 = auVar49._0_4_;
    fVar44 = auVar49._4_4_;
    fVar45 = auVar49._8_4_;
    fVar46 = auVar49._12_4_;
    fVar37 = fVar44 * fVar44 + fVar53 * fVar53 + fVar59 * fVar59 + fVar38 * fVar38;
    if ((fVar37 != 0.0) || (NAN(fVar37))) {
      fVar37 = 1.0 / SQRT(fVar37);
      auVar68._0_4_ = fVar53 * fVar37;
      auVar68._4_4_ = fVar59 * fVar37;
      auVar68._8_4_ = fVar51 * 0.0;
      auVar68._12_4_ = fVar64 * 0.0;
      auVar49._0_4_ = fVar38 * fVar37;
      auVar49._4_4_ = fVar44 * fVar37;
      auVar49._8_4_ = fVar45 * 0.0;
      auVar49._12_4_ = fVar46 * 0.0;
    }
  }
  if (auVar49._4_4_ * auVar49._4_4_ +
      auVar68._0_4_ * auVar68._0_4_ + auVar68._4_4_ * auVar68._4_4_ + auVar49._0_4_ * auVar49._0_4_
      < 0.5) {
    bVar22 = pParams->m_perceptual == '\0';
    pcVar13 = (color_cell_compressor_results *)(ulong)bVar22;
    auVar27._0_4_ = (uint)bVar22 << 0x1f;
    auVar27._4_4_ = (uint)bVar22 << 0x1f;
    auVar27._8_8_ = 0;
    auVar25 = blendvps(ZEXT816(0x3f370a3d3e5a1cac),_DAT_003166f0,auVar27);
    auVar30._0_4_ = (uint)bVar22 << 0x1f;
    auVar30._4_4_ = (uint)(bVar1 == '\0') << 0x1f;
    auVar30._8_8_ = 0;
    auVar48._0_12_ = ZEXT812(0x3d9374bc);
    auVar48._12_4_ = 0;
    auVar24 = blendps(auVar48,auVar25,0xe);
    auVar56._0_12_ = ZEXT812(0x3f800000);
    auVar56._12_4_ = 0;
    auVar49 = blendvps(auVar24,auVar56,auVar30);
    fVar38 = auVar49._4_4_;
    fVar44 = auVar49._8_4_;
    fVar45 = auVar49._12_4_;
    fVar37 = fVar38 * fVar38 + *(float *)(&DAT_00316720 + (long)pcVar13 * 4);
    if ((fVar37 != 0.0) || (auVar68 = auVar25, NAN(fVar37))) {
      fVar37 = 1.0 / SQRT(fVar37);
      auVar68._0_4_ = auVar25._0_4_ * fVar37;
      auVar68._4_4_ = auVar25._4_4_ * fVar37;
      auVar68._8_4_ = auVar25._8_4_ * 0.0;
      auVar68._12_4_ = auVar25._12_4_ * 0.0;
      auVar49._0_4_ = auVar49._0_4_ * fVar37;
      auVar49._4_4_ = fVar38 * fVar37;
      auVar49._8_4_ = fVar44 * 0.0;
      auVar49._12_4_ = fVar45 * 0.0;
    }
  }
  fVar44 = auVar68._0_4_;
  fVar45 = auVar68._4_4_;
  uVar55 = auVar68._12_4_;
  fVar37 = auVar49._0_4_;
  fVar38 = auVar49._4_4_;
  uVar52 = auVar49._12_4_;
  if (uVar12 == 0) {
    fVar46 = 3921568.8;
    fVar53 = -3921568.8;
  }
  else {
    pcVar13 = (color_cell_compressor_results *)pParams->m_pPixels;
    fVar53 = -1e+09;
    fVar46 = 1e+09;
    uVar16 = 0;
    do {
      auVar24 = ZEXT216(*(ushort *)(&pcVar13->m_low_endpoint)[uVar16 - 2].m_c);
      auVar24 = pmovzxbd(auVar24,auVar24);
      auVar25 = ZEXT216(*(ushort *)((&pcVar13->m_low_endpoint)[uVar16 - 2].m_c + 2));
      auVar25 = pmovzxbd(auVar25,auVar25);
      fVar59 = ((float)auVar25._4_4_ - fVar36 * fVar23) * fVar38 +
               ((float)auVar24._0_4_ - fVar39) * fVar44 + ((float)auVar24._4_4_ - fVar43) * fVar45 +
               ((float)auVar25._0_4_ - fVar33) * fVar37;
      if (fVar59 <= fVar46) {
        fVar46 = fVar59;
      }
      if (fVar53 <= fVar59) {
        fVar53 = fVar59;
      }
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
    fVar46 = fVar46 * 0.003921569;
    fVar53 = fVar53 * 0.003921569;
  }
  fVar36 = fVar44 * fVar46 + local_d0;
  fVar33 = fVar45 * fVar46 + (float)local_8c.m_c;
  auVar34 = ZEXT816(0);
  auVar41 = ZEXT816(0);
  if ((0.0 <= fVar36) &&
     (auVar41._4_4_ = fVar45, auVar41._0_4_ = fVar36, auVar41._8_4_ = auVar68._8_4_,
     auVar41._12_4_ = uVar55, 1.0 < fVar36)) {
    auVar41._0_12_ = ZEXT812(0x3f800000);
    auVar41._12_4_ = 0;
  }
  fVar36 = fVar37 * fVar46 + local_cc;
  if ((0.0 <= fVar33) &&
     (auVar34._4_4_ = fVar45, auVar34._0_4_ = fVar33, auVar34._8_4_ = uVar55,
     auVar34._12_4_ = uVar55, 1.0 < fVar33)) {
    auVar34._0_12_ = ZEXT812(0x3f800000);
    auVar34._12_4_ = 0;
  }
  fVar33 = fVar46 * fVar38 + local_d4;
  auVar62._0_12_ = ZEXT812(0);
  auVar62._12_4_ = 0;
  auVar67._0_12_ = ZEXT812(0);
  auVar67._12_4_ = 0;
  if ((0.0 <= fVar36) &&
     (auVar67._4_4_ = fVar38, auVar67._0_4_ = fVar36, auVar67._8_4_ = auVar49._8_4_,
     auVar67._12_4_ = uVar52, 1.0 < fVar36)) {
    auVar67._0_12_ = ZEXT812(0x3f800000);
    auVar67._12_4_ = 0;
  }
  fVar36 = fVar44 * fVar53 + local_d0;
  if ((0.0 <= fVar33) && (auVar62 = ZEXT416((uint)fVar33), 1.0 < fVar33)) {
    auVar62._0_12_ = ZEXT812(0x3f800000);
    auVar62._12_4_ = 0;
  }
  fVar33 = fVar45 * fVar53 + (float)local_8c.m_c;
  auVar80._0_12_ = ZEXT812(0);
  auVar80._12_4_ = 0;
  auVar28._0_12_ = ZEXT812(0);
  auVar28._12_4_ = 0;
  if ((0.0 <= fVar36) &&
     (auVar28._4_4_ = fVar45, auVar28._0_4_ = fVar36, auVar28._8_4_ = auVar68._8_4_,
     auVar28._12_4_ = uVar55, 1.0 < fVar36)) {
    auVar28._0_12_ = ZEXT812(0x3f800000);
    auVar28._12_4_ = 0;
  }
  fVar36 = fVar37 * fVar53 + local_cc;
  if ((0.0 <= fVar33) &&
     (auVar80._4_4_ = fVar45, auVar80._0_4_ = fVar33, auVar80._8_4_ = uVar55,
     auVar80._12_4_ = uVar55, 1.0 < fVar33)) {
    auVar80._0_12_ = ZEXT812(0x3f800000);
    auVar80._12_4_ = 0;
  }
  fVar33 = fVar38 * fVar53 + local_d4;
  auVar54._0_12_ = ZEXT812(0);
  auVar54._12_4_ = 0;
  auVar31 = ZEXT816(0);
  if ((0.0 <= fVar36) &&
     (auVar31._4_4_ = fVar38, auVar31._0_4_ = fVar36, auVar31._8_4_ = auVar49._8_4_,
     auVar31._12_4_ = uVar52, 1.0 < fVar36)) {
    auVar31._0_12_ = ZEXT812(0x3f800000);
    auVar31._12_4_ = 0;
  }
  if ((0.0 <= fVar33) &&
     (auVar54._4_4_ = fVar38, auVar54._0_4_ = fVar33, auVar54._8_4_ = uVar52,
     auVar54._12_4_ = uVar52, 1.0 < fVar33)) {
    auVar54._0_12_ = ZEXT812(0x3f800000);
    auVar54._12_4_ = 0;
  }
  auVar50 = insertps(auVar41,auVar34,0x10);
  auVar57 = insertps(auVar67,auVar62,0x10);
  auVar42 = insertps(auVar41,auVar28,0x10);
  auVar29 = insertps(auVar28,auVar80,0x10);
  auVar35 = insertps(auVar34,auVar80,0x10);
  auVar68 = insertps(auVar67,auVar31,0x10);
  auVar32 = insertps(auVar31,auVar54,0x10);
  auVar63 = insertps(auVar62,auVar54,0x10);
  auVar24 = auVar50;
  auVar25 = auVar57;
  if (auVar63._4_4_ + auVar68._4_4_ + auVar35._4_4_ + auVar42._4_4_ <
      auVar63._0_4_ + auVar68._0_4_ + auVar35._0_4_ + auVar42._0_4_) {
    auVar24 = auVar29;
    auVar25 = auVar32;
    auVar29 = auVar50;
    auVar32 = auVar57;
  }
  xl.m_c._0_8_ = auVar24._0_8_;
  xl.m_c._8_8_ = auVar25._0_8_;
  xh.m_c._0_8_ = auVar29._0_8_;
  xh.m_c._8_8_ = auVar32._0_8_;
  mode_00 = (uint32_t)pParams;
  uVar11 = find_optimal_solution
                     ((basisu *)(ulong)local_d8,mode_00,xl,xh,
                      (color_cell_compressor_params *)pResults,pcVar13);
  if (uVar11 == 0) {
    return 0;
  }
  if (local_88->m_least_squares_passes != 0) {
    uVar17 = 0;
    do {
      local_78.m_best_overall_err = 0;
      local_78.m_low_endpoint.m_c[0] = '\0';
      local_78.m_low_endpoint.m_c[1] = '\0';
      local_78.m_low_endpoint.m_c[2] = '\0';
      local_78.m_low_endpoint.m_c[3] = '\0';
      local_78.m_high_endpoint.m_c[0] = '\0';
      local_78.m_high_endpoint.m_c[1] = '\0';
      local_78.m_high_endpoint.m_c[2] = '\0';
      local_78.m_high_endpoint.m_c[3] = '\0';
      local_b8._16_4_ = 0;
      local_b8._20_4_ = 0;
      puStack_a0 = (uint8_t *)0x0;
      pcVar13 = &local_78;
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (bc7enc_vec4F *)&local_78,(bc7enc_vec4F *)(local_b8 + 0x10),pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (bc7enc_vec4F *)&local_78,(bc7enc_vec4F *)(local_b8 + 0x10),pParams->m_pPixels);
      }
      xl_00.m_c[0] = (float)local_78.m_best_overall_err * 0.003921569;
      xl_00.m_c[1] = (float)(local_78.m_best_overall_err >> 0x20) * 0.003921569;
      xl_00.m_c[2] = (float)local_78.m_low_endpoint.m_c * 0.003921569;
      xl_00.m_c[3] = (float)local_78.m_high_endpoint.m_c * 0.003921569;
      xh_00.m_c[0] = (float)local_b8._16_8_ * 0.003921569;
      xh_00.m_c[1] = SUB84(local_b8._16_8_,4) * 0.003921569;
      xh_00.m_c[2] = SUB84(puStack_a0,0) * 0.003921569;
      xh_00.m_c[3] = (float)((ulong)puStack_a0 >> 0x20) * 0.003921569;
      uVar11 = find_optimal_solution
                         ((basisu *)(ulong)local_d8,mode_00,xl_00,xh_00,
                          (color_cell_compressor_params *)pResults,pcVar13);
      if (uVar11 == 0) {
        return 0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < local_88->m_least_squares_passes);
  }
  if (pParams->m_pForce_selectors != (uint8_t *)0x0) goto switchD_00207d7e_caseD_9;
  cVar40.m_c = local_8c.m_c;
  fVar33 = local_cc;
  fVar36 = local_d0;
  fVar37 = local_d4;
  if (local_88->m_uber_level != 0) {
    uVar17 = pParams->m_num_pixels;
    uVar12 = (ulong)uVar17;
    memcpy(&local_78,pResults->m_pSelectors,uVar12);
    local_38 = (ulong)pParams->m_num_selector_weights;
    uVar18 = pParams->m_num_selector_weights - 1;
    if (uVar12 == 0) {
      uVar20 = 0;
      uVar19 = 0x100;
    }
    else {
      uVar16 = 0;
      uVar19 = 0x100;
      uVar20 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_78.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar16);
        if (bVar2 <= uVar19) {
          uVar19 = (uint)bVar2;
        }
        uVar10 = (uint)bVar2;
        if (bVar2 < uVar20) {
          uVar10 = uVar20;
        }
        uVar20 = uVar10;
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
      if (uVar12 != 0) {
        uVar16 = 0;
        do {
          bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_78.m_low_endpoint + -2)
                                   )->m_best_overall_err + uVar16);
          local_b8[uVar16 + 0x10] =
               bVar2 + ((bVar2 <= uVar18 && uVar18 != bVar2) && uVar19 == bVar2);
          uVar16 = uVar16 + 1;
        } while (uVar12 != uVar16);
      }
    }
    local_b8._0_8_ = 0;
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_c8.m_c[0] = 0.0;
    local_c8.m_c[1] = 0.0;
    local_c8.m_c[2] = 0.0;
    local_c8.m_c[3] = 0.0;
    pcVar13 = (color_cell_compressor_results *)local_b8;
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar17,local_b8 + 0x10,pParams->m_pSelector_weightsx,(bc7enc_vec4F *)pcVar13,
                 &local_c8,pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar17,local_b8 + 0x10,pParams->m_pSelector_weightsx,(bc7enc_vec4F *)pcVar13,
                 &local_c8,pParams->m_pPixels);
    }
    xl_01.m_c._0_8_ =
         CONCAT44(SUB84(local_b8._0_8_,4) * 0.003921569,(float)local_b8._0_8_ * 0.003921569);
    cVar40.m_c = SUB84(local_b8._8_8_,4);
    local_b8._8_4_ = (float)SUB84(local_b8._8_8_,0) * 0.003921569;
    local_b8._12_4_ = (float)cVar40.m_c * 0.003921569;
    fVar33 = local_c8.m_c[1];
    local_c8.m_c[0] = local_c8.m_c[0] * 0.003921569;
    local_c8.m_c[1] = fVar33 * 0.003921569;
    fVar33 = local_c8.m_c[3];
    local_c8.m_c[2] = local_c8.m_c[2] * 0.003921569;
    local_c8.m_c[3] = fVar33 * 0.003921569;
    xl_01.m_c[2] = (float)local_b8._8_4_;
    xl_01.m_c[3] = (float)local_b8._12_4_;
    xh_01.m_c[2] = local_c8.m_c[2];
    xh_01.m_c[3] = local_c8.m_c[3];
    xh_01.m_c[0] = local_c8.m_c[0];
    xh_01.m_c[1] = local_c8.m_c[1];
    local_b8._0_8_ = xl_01.m_c._0_8_;
    uVar11 = find_optimal_solution
                       ((basisu *)(ulong)local_d8,mode_00,xl_01,xh_01,
                        (color_cell_compressor_params *)pResults,pcVar13);
    if (uVar11 == 0) {
      return 0;
    }
    uVar17 = pParams->m_num_pixels;
    if ((ulong)uVar17 != 0) {
      uVar12 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_78.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar12);
        local_b8[uVar12 + 0x10] = bVar2 - (uVar20 == bVar2 && bVar2 != 0);
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
    }
    pcVar13 = (color_cell_compressor_results *)local_b8;
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar17,local_b8 + 0x10,pParams->m_pSelector_weightsx,(bc7enc_vec4F *)pcVar13,
                 &local_c8,pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar17,local_b8 + 0x10,pParams->m_pSelector_weightsx,(bc7enc_vec4F *)pcVar13,
                 &local_c8,pParams->m_pPixels);
    }
    xl_02.m_c._0_8_ =
         CONCAT44(SUB84(local_b8._0_8_,4) * 0.003921569,(float)local_b8._0_8_ * 0.003921569);
    cVar40.m_c = SUB84(local_b8._8_8_,4);
    local_b8._8_4_ = (float)SUB84(local_b8._8_8_,0) * 0.003921569;
    local_b8._12_4_ = (float)cVar40.m_c * 0.003921569;
    fVar33 = local_c8.m_c[1];
    local_c8.m_c[0] = local_c8.m_c[0] * 0.003921569;
    local_c8.m_c[1] = fVar33 * 0.003921569;
    fVar33 = local_c8.m_c[3];
    local_c8.m_c[2] = local_c8.m_c[2] * 0.003921569;
    local_c8.m_c[3] = fVar33 * 0.003921569;
    xl_02.m_c[2] = (float)local_b8._8_4_;
    xl_02.m_c[3] = (float)local_b8._12_4_;
    xh_02.m_c[2] = local_c8.m_c[2];
    xh_02.m_c[3] = local_c8.m_c[3];
    xh_02.m_c[0] = local_c8.m_c[0];
    xh_02.m_c[1] = local_c8.m_c[1];
    local_b8._0_8_ = xl_02.m_c._0_8_;
    uVar11 = find_optimal_solution
                       ((basisu *)(ulong)local_d8,mode_00,xl_02,xh_02,
                        (color_cell_compressor_params *)pResults,pcVar13);
    if (uVar11 == 0) {
      return 0;
    }
    uVar17 = pParams->m_num_pixels;
    if ((ulong)uVar17 != 0) {
      uVar12 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_78.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar12);
        if ((uVar19 != bVar2) || (cVar14 = '\x01', pParams->m_num_selector_weights - 1 <= uVar19)) {
          cVar14 = -(bVar2 != 0 && uVar20 == bVar2);
        }
        local_b8[uVar12 + 0x10] = bVar2 + cVar14;
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
    }
    pcVar13 = (color_cell_compressor_results *)local_b8;
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar17,local_b8 + 0x10,pParams->m_pSelector_weightsx,(bc7enc_vec4F *)pcVar13,
                 &local_c8,pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar17,local_b8 + 0x10,pParams->m_pSelector_weightsx,(bc7enc_vec4F *)pcVar13,
                 &local_c8,pParams->m_pPixels);
    }
    xl_03.m_c[0] = (float)local_b8._0_8_ * 0.003921569;
    xl_03.m_c[1] = SUB84(local_b8._0_8_,4) * 0.003921569;
    xl_03.m_c[2] = (float)SUB84(local_b8._8_8_,0) * 0.003921569;
    xl_03.m_c[3] = (float)SUB84(local_b8._8_8_,4) * 0.003921569;
    xh_03.m_c[0] = local_c8.m_c[0] * 0.003921569;
    xh_03.m_c[1] = local_c8.m_c[1] * 0.003921569;
    xh_03.m_c[2] = local_c8.m_c[2] * 0.003921569;
    xh_03.m_c[3] = local_c8.m_c[3] * 0.003921569;
    uVar11 = find_optimal_solution
                       ((basisu *)(ulong)local_d8,mode_00,xl_03,xh_03,
                        (color_cell_compressor_params *)pResults,pcVar13);
    if (uVar11 == 0) {
      return 0;
    }
    uVar17 = local_88->m_uber_level;
    cVar40.m_c = local_8c.m_c;
    fVar33 = local_cc;
    fVar36 = local_d0;
    fVar37 = local_d4;
    if ((1 < uVar17) && ((ulong)(pParams->m_num_pixels * 0x38 >> 4) < pResults->m_best_overall_err))
    {
      iVar15 = 1;
      if (3 < uVar17) {
        iVar15 = uVar17 - 2;
      }
      if (-2 < iVar15) {
        iVar21 = -iVar15;
        iVar8 = (int)local_38;
        local_7c = iVar8 - 2;
        fVar38 = (float)(int)uVar18;
        uVar19 = 3;
        if (3 < uVar17) {
          uVar19 = uVar17;
        }
        local_40 = iVar15 + uVar18;
        local_3c = fVar38;
        do {
          if ((int)local_7c <= local_40) {
            fVar39 = (float)iVar21;
            local_88 = (bc7enc_compress_block_params *)CONCAT44(local_88._4_4_,fVar39);
            uVar17 = local_7c;
            do {
              if (uVar17 != uVar18 || iVar21 != 0) {
                uVar20 = pParams->m_num_pixels;
                if ((ulong)uVar20 != 0) {
                  uVar12 = 0;
                  do {
                    auVar24 = roundss(ZEXT816(0),
                                      ZEXT416((uint)((((float)*(byte *)((long)&((
                                                  color_cell_compressor_results *)
                                                  (&local_78.m_low_endpoint + -2))->
                                                  m_best_overall_err + uVar12) - fVar39) * fVar38) /
                                                  ((float)(int)uVar17 - fVar39) + 0.5)),9);
                    fVar36 = auVar24._0_4_;
                    fVar33 = 0.0;
                    if ((0.0 <= fVar36) && (fVar33 = fVar36, fVar38 < fVar36)) {
                      fVar33 = fVar38;
                    }
                    local_b8[uVar12 + 0x10] = (char)(int)fVar33;
                    uVar12 = uVar12 + 1;
                  } while (uVar20 != uVar12);
                }
                local_b8._0_8_ = 0;
                local_b8[8] = '\0';
                local_b8[9] = '\0';
                local_b8[10] = '\0';
                local_b8[0xb] = '\0';
                local_b8[0xc] = '\0';
                local_b8[0xd] = '\0';
                local_b8[0xe] = '\0';
                local_b8[0xf] = '\0';
                local_c8.m_c[0] = 0.0;
                local_c8.m_c[1] = 0.0;
                local_c8.m_c[2] = 0.0;
                local_c8.m_c[3] = 0.0;
                pcVar13 = (color_cell_compressor_results *)local_b8;
                if (pParams->m_has_alpha == '\0') {
                  compute_least_squares_endpoints_rgb
                            (uVar20,local_b8 + 0x10,pParams->m_pSelector_weightsx,
                             (bc7enc_vec4F *)pcVar13,&local_c8,pParams->m_pPixels);
                }
                else {
                  compute_least_squares_endpoints_rgba
                            (uVar20,local_b8 + 0x10,pParams->m_pSelector_weightsx,
                             (bc7enc_vec4F *)pcVar13,&local_c8,pParams->m_pPixels);
                }
                xl_04.m_c._0_8_ =
                     CONCAT44(SUB84(local_b8._0_8_,4) * 0.003921569,
                              (float)local_b8._0_8_ * 0.003921569);
                cVar40.m_c = SUB84(local_b8._8_8_,4);
                local_b8._8_4_ = (float)SUB84(local_b8._8_8_,0) * 0.003921569;
                local_b8._12_4_ = (float)cVar40.m_c * 0.003921569;
                fVar33 = local_c8.m_c[1];
                local_c8.m_c[0] = local_c8.m_c[0] * 0.003921569;
                local_c8.m_c[1] = fVar33 * 0.003921569;
                fVar33 = local_c8.m_c[3];
                local_c8.m_c[2] = local_c8.m_c[2] * 0.003921569;
                local_c8.m_c[3] = fVar33 * 0.003921569;
                xl_04.m_c[2] = (float)local_b8._8_4_;
                xl_04.m_c[3] = (float)local_b8._12_4_;
                xh_04.m_c[2] = local_c8.m_c[2];
                xh_04.m_c[3] = local_c8.m_c[3];
                xh_04.m_c[0] = local_c8.m_c[0];
                xh_04.m_c[1] = local_c8.m_c[1];
                local_b8._0_8_ = xl_04.m_c._0_8_;
                uVar11 = find_optimal_solution
                                   ((basisu *)(ulong)local_d8,mode_00,xl_04,xh_04,
                                    (color_cell_compressor_params *)pResults,pcVar13);
                cVar40.m_c = local_8c.m_c;
                fVar33 = local_cc;
                fVar36 = local_d0;
                fVar37 = local_d4;
                fVar39 = local_88._0_4_;
                fVar38 = local_3c;
                if (uVar11 == 0) {
                  return 0;
                }
              }
              bVar22 = uVar17 != (iVar8 + uVar19) - 3;
              uVar17 = uVar17 + 1;
            } while (bVar22);
          }
          iVar21 = iVar21 + 1;
        } while (iVar21 != 2);
      }
    }
    if (pParams->m_pForce_selectors != (uint8_t *)0x0) goto switchD_00207d7e_caseD_9;
  }
  if (local_d8 == 1) {
    local_78.m_best_overall_err = pResults->m_best_overall_err;
    local_78.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
    local_78.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
    local_78.m_pbits = *&pResults->m_pbits;
    local_78.m_pSelectors = pResults->m_pSelectors;
    local_78.m_pSelectors_temp = pResults->m_pSelectors_temp;
    local_78.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
    local_78.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
    uVar12 = pack_mode1_to_one_color
                       (pParams,&local_78,(int)(fVar36 * 255.0 + 0.5),
                        (int)((float)cVar40.m_c * 255.0 + 0.5),(int)(fVar33 * 255.0 + 0.5),
                        pResults->m_pSelectors_temp);
  }
  else {
    switch(pParams->m_astc_endpoint_range) {
    case 7:
      if ((pParams->m_num_selector_weights != 4) || (pParams->m_has_alpha != '\0'))
      goto switchD_00207d7e_caseD_9;
      local_78.m_best_overall_err = pResults->m_best_overall_err;
      local_78.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_78.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_78.m_pbits = *&pResults->m_pbits;
      local_78.m_pSelectors = pResults->m_pSelectors;
      local_78.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_78.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_78.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar12 = pack_astc_range7_2bit_to_one_color
                         (pParams,&local_78,(int)(fVar36 * 255.0 + 0.5),
                          (int)((float)cVar40.m_c * 255.0 + 0.5),(int)(fVar33 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
      break;
    case 8:
      if (pParams->m_num_selector_weights == 4) {
        if (pParams->m_has_alpha == '\0') goto switchD_00207d7e_caseD_9;
        local_78.m_best_overall_err = pResults->m_best_overall_err;
        local_78.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
        local_78.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
        local_78.m_pbits = *&pResults->m_pbits;
        local_78.m_pSelectors = pResults->m_pSelectors;
        local_78.m_pSelectors_temp = pResults->m_pSelectors_temp;
        local_78.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
        local_78.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
        uVar12 = pack_astc_4bit_2bit_to_one_color_rgba
                           (pParams,&local_78,(int)(fVar36 * 255.0 + 0.5),
                            (int)((float)cVar40.m_c * 255.0 + 0.5),(int)(fVar33 * 255.0 + 0.5),
                            (int)(fVar37 * 255.0 + 0.5),pResults->m_pSelectors_temp);
      }
      else {
        if ((pParams->m_num_selector_weights != 8) || (pParams->m_has_alpha != '\0'))
        goto switchD_00207d7e_caseD_9;
        local_78.m_best_overall_err = pResults->m_best_overall_err;
        local_78.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
        local_78.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
        local_78.m_pbits = *&pResults->m_pbits;
        local_78.m_pSelectors = pResults->m_pSelectors;
        local_78.m_pSelectors_temp = pResults->m_pSelectors_temp;
        local_78.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
        local_78.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
        uVar12 = pack_astc_4bit_3bit_to_one_color
                           (pParams,&local_78,(int)(fVar36 * 255.0 + 0.5),
                            (int)((float)cVar40.m_c * 255.0 + 0.5),(int)(fVar33 * 255.0 + 0.5),
                            pResults->m_pSelectors_temp);
      }
      break;
    default:
      goto switchD_00207d7e_caseD_9;
    case 0xb:
      if ((pParams->m_num_selector_weights != 0x20) || (pParams->m_has_alpha != '\0'))
      goto switchD_00207d7e_caseD_9;
      local_78.m_best_overall_err = pResults->m_best_overall_err;
      local_78.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_78.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_78.m_pbits = *&pResults->m_pbits;
      local_78.m_pSelectors = pResults->m_pSelectors;
      local_78.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_78.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_78.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar12 = pack_astc_range11_5bit_to_one_color
                         (pParams,&local_78,(int)(fVar36 * 255.0 + 0.5),
                          (int)((float)cVar40.m_c * 255.0 + 0.5),(int)(fVar33 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
      break;
    case 0xd:
      if ((pParams->m_num_selector_weights != 4) || (pParams->m_has_alpha != '\0'))
      goto switchD_00207d7e_caseD_9;
      local_78.m_best_overall_err = pResults->m_best_overall_err;
      local_78.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_78.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_78.m_pbits = *&pResults->m_pbits;
      local_78.m_pSelectors = pResults->m_pSelectors;
      local_78.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_78.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_78.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar12 = pack_astc_range13_2bit_to_one_color
                         (pParams,&local_78,(int)(fVar36 * 255.0 + 0.5),
                          (int)((float)cVar40.m_c * 255.0 + 0.5),(int)(fVar33 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
    }
  }
  if (uVar12 < pResults->m_best_overall_err) {
    *&pResults->m_pbits = local_78.m_pbits;
    pResults->m_pSelectors = local_78.m_pSelectors;
    pResults->m_pSelectors_temp = local_78.m_pSelectors_temp;
    pResults->m_astc_low_endpoint = (color_quad_u8)local_78.m_astc_low_endpoint.m_c;
    pResults->m_astc_high_endpoint = (color_quad_u8)local_78.m_astc_high_endpoint.m_c;
    pResults->m_best_overall_err = local_78.m_best_overall_err;
    pResults->m_low_endpoint = (color_quad_u8)local_78.m_low_endpoint.m_c;
    pResults->m_high_endpoint = (color_quad_u8)local_78.m_high_endpoint.m_c;
    memcpy(pResults->m_pSelectors,pResults->m_pSelectors_temp,(ulong)pParams->m_num_pixels);
    pResults->m_best_overall_err = uVar12;
  }
switchD_00207d7e_caseD_9:
  return pResults->m_best_overall_err;
}

Assistant:

uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	if (!pParams->m_astc_endpoint_range)
	{
		assert((mode == 6) || (!pParams->m_has_alpha));
	}
	assert(pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32);
	assert(pParams->m_pSelector_weights[0] == 0);
	assert(pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64);

	pResults->m_best_overall_err = UINT64_MAX;

	uint32_t cr, cg, cb, ca;

	// If the partition's colors are all the same, then just pack them as a single color.
	if (!pParams->m_pForce_selectors)
	{
		if (mode == 1)
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_4bit_3bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range7_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			if (is_solid_rgba(pParams, cr, cg, cb, ca))
				return pack_astc_4bit_2bit_to_one_color_rgba(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range13_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range11_5bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
	}

	// Compute partition's mean color and principle axis.
	bc7enc_vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	bc7enc_vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);
	
	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			bc7enc_vec4F a = vec4F_mul(&color, color.m_c[0]);
			bc7enc_vec4F b = vec4F_mul(&color, color.m_c[1]);
			bc7enc_vec4F c = vec4F_mul(&color, color.m_c[2]);
			bc7enc_vec4F d = vec4F_mul(&color, color.m_c[3]);
			bc7enc_vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float xr = .9f, xg = 1.0f, xb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
			float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
			float b = xr * cov[2] + xg * cov[4] + xb * cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m; b *= m;
			}

			xr = r; xg = g; xb = b;
		}

		float len = xr * xr + xg * xg + xb * xb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			xr *= len; xg *= len; xb *= len;
			vec4F_set(&axis, xr, xg, xb, 0);
		}
	}
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}
			
	bc7enc_vec4F minColor, maxColor;

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		bc7enc_vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	bc7enc_vec4F b0 = vec4F_mul(&axis, l);
	bc7enc_vec4F b1 = vec4F_mul(&axis, h);
	bc7enc_vec4F c0 = vec4F_add(&meanColor, &b0);
	bc7enc_vec4F c1 = vec4F_add(&meanColor, &b1);
	minColor = vec4F_saturate(&c0);
	maxColor = vec4F_saturate(&c1);
				
	bc7enc_vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);
	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 1
		std::swap(minColor.m_c[0], maxColor.m_c[0]);
		std::swap(minColor.m_c[1], maxColor.m_c[1]);
		std::swap(minColor.m_c[2], maxColor.m_c[2]);
		std::swap(minColor.m_c[3], maxColor.m_c[3]);
#elif 0
		// Fails to compile correctly with MSVC 2019 (code generation bug)
		std::swap(minColor, maxColor);
#else
		// Fails with MSVC 2019
		bc7enc_vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	for (uint32_t i = 0; i < pComp_params->m_least_squares_passes; i++)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if ((!pParams->m_pForce_selectors) && (pComp_params->m_uber_level > 0))
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 256;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//bc7enc_vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}
	
	if (!pParams->m_pForce_selectors)
	{
		// Try encoding the partition as a single color by using the optimal single colors tables to encode the block to its mean.
		if (mode == 1)
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_3bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range7_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_2bit_to_one_color_rgba(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range13_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range11_5bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
	}

#if BC7ENC_CHECK_OVERALL_ERROR
	check_best_overall_error(pParams, pResults);
#endif
		
	return pResults->m_best_overall_err;
}